

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

xmlCharEncodingHandlerPtr xmlFindCharEncodingHandler(char *name)

{
  __int32_t _Var1;
  xmlCharEncodingHandlerPtr *ppxVar2;
  int iVar3;
  xmlCharEncoding enc;
  char *pcVar4;
  __int32_t **pp_Var5;
  iconv_t __cd;
  iconv_t __cd_00;
  xmlCharEncodingHandlerPtr pxVar6;
  char *__s2;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  char upper [100];
  
  if (handlers == (xmlCharEncodingHandlerPtr *)0x0) {
    xmlInitCharEncodingHandlers();
  }
  if ((name != (char *)0x0) && (*name != '\0')) {
    pcVar4 = xmlGetEncodingAlias(name);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = name;
    }
    for (lVar8 = 0; lVar8 != 99; lVar8 = lVar8 + 1) {
      pp_Var5 = __ctype_toupper_loc();
      _Var1 = (*pp_Var5)[pcVar4[lVar8]];
      upper[lVar8] = (char)_Var1;
      if ((char)_Var1 == '\0') break;
    }
    ppxVar2 = handlers;
    upper[lVar8] = '\0';
    if (handlers != (xmlCharEncodingHandlerPtr *)0x0) {
      uVar9 = 0;
      uVar7 = (ulong)(uint)nbCharEncodingHandler;
      if (nbCharEncodingHandler < 1) {
        uVar7 = uVar9;
      }
      while (uVar7 != uVar9) {
        pxVar6 = ppxVar2[uVar9];
        iVar3 = strcmp(upper,pxVar6->name);
        uVar9 = uVar9 + 1;
        if (iVar3 == 0) {
          return pxVar6;
        }
      }
    }
    __cd = iconv_open("UTF-8",pcVar4);
    __cd_00 = iconv_open(pcVar4,"UTF-8");
    if (__cd == (iconv_t)0xffffffffffffffff) {
      __cd = iconv_open("UTF-8",upper);
    }
    if (__cd_00 == (iconv_t)0xffffffffffffffff) {
      __cd_00 = iconv_open(upper,"UTF-8");
    }
    if (__cd_00 == (iconv_t)0xffffffffffffffff || __cd == (iconv_t)0xffffffffffffffff) {
      if (((ulong)__cd & (ulong)__cd_00) != 0xffffffffffffffff) {
        xmlEncodingErr(XML_ERR_INTERNAL_ERROR,"iconv : problems with filters for \'%s\'\n",pcVar4);
      }
      enc = xmlParseCharEncoding(name);
      if (((enc != XML_CHAR_ENCODING_ERROR) &&
          (__s2 = xmlGetCharEncodingName(enc), __s2 != (char *)0x0)) &&
         (iVar3 = strcmp(pcVar4,__s2), iVar3 != 0)) {
        pxVar6 = xmlFindCharEncodingHandler(__s2);
        return pxVar6;
      }
    }
    else {
      pxVar6 = (xmlCharEncodingHandlerPtr)(*xmlMalloc)(0x28);
      if (pxVar6 != (xmlCharEncodingHandlerPtr)0x0) {
        pxVar6->output = (xmlCharEncodingOutputFunc)0x0;
        pxVar6->iconv_in = (iconv_t)0x0;
        pxVar6->name = (char *)0x0;
        pxVar6->input = (xmlCharEncodingInputFunc)0x0;
        pxVar6->iconv_out = (iconv_t)0x0;
        pcVar4 = (*xmlMemStrdup)(pcVar4);
        pxVar6->name = pcVar4;
        pxVar6->input = (xmlCharEncodingInputFunc)0x0;
        pxVar6->output = (xmlCharEncodingOutputFunc)0x0;
        pxVar6->iconv_in = __cd;
        pxVar6->iconv_out = __cd_00;
        return pxVar6;
      }
      iconv_close(__cd);
      iconv_close(__cd_00);
    }
  }
  return (xmlCharEncodingHandlerPtr)0x0;
}

Assistant:

xmlCharEncodingHandlerPtr
xmlFindCharEncodingHandler(const char *name) {
    const char *nalias;
    const char *norig;
    xmlCharEncoding alias;
#ifdef LIBXML_ICONV_ENABLED
    xmlCharEncodingHandlerPtr enc;
    iconv_t icv_in, icv_out;
#endif /* LIBXML_ICONV_ENABLED */
#ifdef LIBXML_ICU_ENABLED
    xmlCharEncodingHandlerPtr encu;
    uconv_t *ucv_in, *ucv_out;
#endif /* LIBXML_ICU_ENABLED */
    char upper[100];
    int i;

    if (handlers == NULL) xmlInitCharEncodingHandlers();
    if (name == NULL) return(xmlDefaultCharEncodingHandler);
    if (name[0] == 0) return(xmlDefaultCharEncodingHandler);

    /*
     * Do the alias resolution
     */
    norig = name;
    nalias = xmlGetEncodingAlias(name);
    if (nalias != NULL)
	name = nalias;

    /*
     * Check first for directly registered encoding names
     */
    for (i = 0;i < 99;i++) {
        upper[i] = toupper(name[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    if (handlers != NULL) {
        for (i = 0;i < nbCharEncodingHandler; i++) {
            if (!strcmp(upper, handlers[i]->name)) {
#ifdef DEBUG_ENCODING
                xmlGenericError(xmlGenericErrorContext,
                        "Found registered handler for encoding %s\n", name);
#endif
                return(handlers[i]);
            }
        }
    }

#ifdef LIBXML_ICONV_ENABLED
    /* check whether iconv can handle this */
    icv_in = iconv_open("UTF-8", name);
    icv_out = iconv_open(name, "UTF-8");
    if (icv_in == (iconv_t) -1) {
        icv_in = iconv_open("UTF-8", upper);
    }
    if (icv_out == (iconv_t) -1) {
	icv_out = iconv_open(upper, "UTF-8");
    }
    if ((icv_in != (iconv_t) -1) && (icv_out != (iconv_t) -1)) {
	    enc = (xmlCharEncodingHandlerPtr)
	          xmlMalloc(sizeof(xmlCharEncodingHandler));
	    if (enc == NULL) {
	        iconv_close(icv_in);
	        iconv_close(icv_out);
		return(NULL);
	    }
            memset(enc, 0, sizeof(xmlCharEncodingHandler));
	    enc->name = xmlMemStrdup(name);
	    enc->input = NULL;
	    enc->output = NULL;
	    enc->iconv_in = icv_in;
	    enc->iconv_out = icv_out;
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
		    "Found iconv handler for encoding %s\n", name);
#endif
	    return enc;
    } else if ((icv_in != (iconv_t) -1) || icv_out != (iconv_t) -1) {
	    xmlEncodingErr(XML_ERR_INTERNAL_ERROR,
		    "iconv : problems with filters for '%s'\n", name);
    }
#endif /* LIBXML_ICONV_ENABLED */
#ifdef LIBXML_ICU_ENABLED
    /* check whether icu can handle this */
    ucv_in = openIcuConverter(name, 1);
    ucv_out = openIcuConverter(name, 0);
    if (ucv_in != NULL && ucv_out != NULL) {
	    encu = (xmlCharEncodingHandlerPtr)
	           xmlMalloc(sizeof(xmlCharEncodingHandler));
	    if (encu == NULL) {
                closeIcuConverter(ucv_in);
                closeIcuConverter(ucv_out);
		return(NULL);
	    }
            memset(encu, 0, sizeof(xmlCharEncodingHandler));
	    encu->name = xmlMemStrdup(name);
	    encu->input = NULL;
	    encu->output = NULL;
	    encu->uconv_in = ucv_in;
	    encu->uconv_out = ucv_out;
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
		    "Found ICU converter handler for encoding %s\n", name);
#endif
	    return encu;
    } else if (ucv_in != NULL || ucv_out != NULL) {
            closeIcuConverter(ucv_in);
            closeIcuConverter(ucv_out);
	    xmlEncodingErr(XML_ERR_INTERNAL_ERROR,
		    "ICU converter : problems with filters for '%s'\n", name);
    }
#endif /* LIBXML_ICU_ENABLED */

#ifdef DEBUG_ENCODING
    xmlGenericError(xmlGenericErrorContext,
	    "No handler found for encoding %s\n", name);
#endif

    /*
     * Fallback using the canonical names
     */
    alias = xmlParseCharEncoding(norig);
    if (alias != XML_CHAR_ENCODING_ERROR) {
        const char* canon;
        canon = xmlGetCharEncodingName(alias);
        if ((canon != NULL) && (strcmp(name, canon))) {
	    return(xmlFindCharEncodingHandler(canon));
        }
    }

    /* If "none of the above", give up */
    return(NULL);
}